

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O0

FT_Error FNT_Load_Glyph(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Memory memory_00;
  int iVar1;
  int iVar2;
  FT_Bitmap *pFVar3;
  ulong uVar4;
  ushort *puVar5;
  uchar *puVar6;
  FT_Byte *pFVar7;
  bool bVar8;
  FT_Byte *limit;
  FT_Byte *write;
  FT_Byte *column;
  FT_UInt pitch;
  FT_Memory memory;
  ulong uStack_58;
  FT_Bool new_format;
  FT_ULong offset;
  FT_Bitmap *bitmap;
  FT_Byte *pFStack_40;
  FT_UInt len;
  FT_Byte *p;
  long lStack_30;
  FT_Error error;
  FNT_Font font;
  FNT_Face face;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size size_local;
  FT_GlyphSlot slot_local;
  
  font = (FNT_Font)size->face;
  p._4_4_ = 0;
  pFVar3 = &slot->bitmap;
  if ((FT_Face)font == (FT_Face)0x0) {
    p._4_4_ = 0x23;
  }
  else {
    lStack_30 = ((FT_Face)((long)font + 0xf8))->num_faces;
    if ((lStack_30 == 0) || ((uint)((FT_Face)font)->num_glyphs <= glyph_index)) {
      p._4_4_ = 6;
    }
    else {
      if (glyph_index == 0) {
        face._4_4_ = (uint)*(byte *)(lStack_30 + 0x76);
      }
      else {
        face._4_4_ = glyph_index - 1;
      }
      bVar8 = *(short *)(lStack_30 + 8) == 0x300;
      iVar1 = 4;
      if (bVar8) {
        iVar1 = 6;
      }
      iVar2 = 0x76;
      if (bVar8) {
        iVar2 = 0x94;
      }
      uVar4 = (ulong)(iVar2 + iVar1 * face._4_4_);
      iVar1 = 2;
      if (bVar8) {
        iVar1 = 4;
      }
      if (uVar4 < (ulong)((*(long *)(lStack_30 + 0x10) + -2) - (long)iVar1)) {
        puVar5 = (ushort *)(*(long *)(lStack_30 + 0xd8) + uVar4);
        (slot->bitmap).width = (uint)*puVar5;
        if (bVar8) {
          uStack_58 = (ulong)((uint)*(byte *)((long)puVar5 + 5) << 0x18 |
                              (uint)(byte)puVar5[2] << 0x10 | (uint)*(byte *)((long)puVar5 + 3) << 8
                             | (uint)(byte)puVar5[1]);
        }
        else {
          uStack_58 = (ulong)puVar5[1];
        }
        if (uStack_58 < *(ulong *)(lStack_30 + 0x10)) {
          pFVar3->rows = (uint)*(ushort *)(lStack_30 + 0x6c);
          (slot->bitmap).pixel_mode = '\x01';
          slot->bitmap_left = 0;
          slot->bitmap_top = (uint)*(ushort *)(lStack_30 + 0x5c);
          slot->format = FT_GLYPH_FORMAT_BITMAP;
          (slot->metrics).width = (ulong)((slot->bitmap).width << 6);
          (slot->metrics).height = (ulong)(pFVar3->rows << 6);
          (slot->metrics).horiAdvance = (ulong)((slot->bitmap).width << 6);
          (slot->metrics).horiBearingX = 0;
          (slot->metrics).horiBearingY = (long)(slot->bitmap_top << 6);
          face._0_4_ = load_flags;
          _load_flags_local = size;
          size_local = (FT_Size)slot;
          ft_synthesize_vertical_metrics(&slot->metrics,(ulong)(pFVar3->rows << 6));
          if (((uint)face & 0x400000) == 0) {
            pFStack_40 = (FT_Byte *)(*(long *)(lStack_30 + 0xd8) + uStack_58);
            memory_00 = *(FT_Memory *)((long)(size_local->generic).data + 0xb8);
            column._4_4_ = (slot->bitmap).width + 7 >> 3;
            (slot->bitmap).pitch = column._4_4_;
            if ((column._4_4_ == 0) ||
               (*(ulong *)(lStack_30 + 0x10) < uStack_58 + column._4_4_ * pFVar3->rows)) {
              p._4_4_ = 3;
            }
            else {
              puVar6 = (uchar *)ft_mem_realloc(memory_00,(ulong)column._4_4_,0,(ulong)pFVar3->rows,
                                               (void *)0x0,(FT_Error *)((long)&p + 4));
              (slot->bitmap).buffer = puVar6;
              if (p._4_4_ == 0) {
                write = (slot->bitmap).buffer;
                for (; column._4_4_ != 0; column._4_4_ = column._4_4_ - 1) {
                  pFVar7 = pFStack_40 + pFVar3->rows;
                  limit = write;
                  for (; pFStack_40 < pFVar7; pFStack_40 = pFStack_40 + 1) {
                    *limit = *pFStack_40;
                    limit = limit + (slot->bitmap).pitch;
                  }
                  write = write + 1;
                }
                *(undefined4 *)(size_local[3].metrics.x_scale + 8) = 1;
              }
            }
          }
        }
        else {
          p._4_4_ = 3;
        }
      }
      else {
        p._4_4_ = 3;
      }
    }
  }
  return p._4_4_;
}

Assistant:

static FT_Error
  FNT_Load_Glyph( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    FNT_Face    face   = (FNT_Face)FT_SIZE_FACE( size );
    FNT_Font    font;
    FT_Error    error  = FT_Err_Ok;
    FT_Byte*    p;
    FT_UInt     len;
    FT_Bitmap*  bitmap = &slot->bitmap;
    FT_ULong    offset;
    FT_Bool     new_format;


    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    font = face->font;

    if ( !font                                                   ||
         glyph_index >= (FT_UInt)( FT_FACE( face )->num_glyphs ) )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "FNT_Load_Glyph: glyph index %d\n", glyph_index ));

    if ( glyph_index > 0 )
      glyph_index--;                           /* revert to real index */
    else
      glyph_index = font->header.default_char; /* the `.notdef' glyph  */

    new_format = FT_BOOL( font->header.version == 0x300 );
    len        = new_format ? 6 : 4;

    /* get glyph width and offset */
    offset = ( new_format ? 148 : 118 ) + len * glyph_index;

    if ( offset >= font->header.file_size - 2 - ( new_format ? 4 : 2 ) )
    {
      FT_TRACE2(( "invalid FNT offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    p = font->fnt_frame + offset;

    bitmap->width = FT_NEXT_USHORT_LE( p );

    /* jump to glyph entry */
    if ( new_format )
      offset = FT_NEXT_ULONG_LE( p );
    else
      offset = FT_NEXT_USHORT_LE( p );

    if ( offset >= font->header.file_size )
    {
      FT_TRACE2(( "invalid FNT offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    bitmap->rows       = font->header.pixel_height;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    slot->bitmap_left     = 0;
    slot->bitmap_top      = font->header.ascent;
    slot->format          = FT_GLYPH_FORMAT_BITMAP;

    /* now set up metrics */
    slot->metrics.width        = (FT_Pos)( bitmap->width << 6 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows << 6 );
    slot->metrics.horiAdvance  = (FT_Pos)( bitmap->width << 6 );
    slot->metrics.horiBearingX = 0;
    slot->metrics.horiBearingY = slot->bitmap_top << 6;

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    (FT_Pos)( bitmap->rows << 6 ) );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* jump to glyph data */
    p = font->fnt_frame + /* font->header.bits_offset */ + offset;

    /* allocate and build bitmap */
    {
      FT_Memory  memory = FT_FACE_MEMORY( slot->face );
      FT_UInt    pitch  = ( bitmap->width + 7 ) >> 3;
      FT_Byte*   column;
      FT_Byte*   write;


      bitmap->pitch = (int)pitch;
      if ( !pitch                                                 ||
           offset + pitch * bitmap->rows > font->header.file_size )
      {
        FT_TRACE2(( "invalid bitmap width\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* note: since glyphs are stored in columns and not in rows we */
      /*       can't use ft_glyphslot_set_bitmap                     */
      if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, pitch ) )
        goto Exit;

      column = (FT_Byte*)bitmap->buffer;

      for ( ; pitch > 0; pitch--, column++ )
      {
        FT_Byte*  limit = p + bitmap->rows;


        for ( write = column; p < limit; p++, write += bitmap->pitch )
          *write = *p;
      }

      slot->internal->flags = FT_GLYPH_OWN_BITMAP;
    }

  Exit:
    return error;
  }